

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

type_conflict1 __thiscall chaiscript::parse_num<double>(chaiscript *this,string_view t_str)

{
  chaiscript cVar1;
  chaiscript *pcVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar4 = 0.0;
  pcVar2 = (chaiscript *)0x0;
  iVar3 = 0;
  dVar7 = 0.0;
  dVar5 = 0.0;
  do {
    if (this == pcVar2) {
      if (iVar3 != 0) {
        dVar5 = pow(10.0,dVar5 * (double)iVar3);
        dVar5 = dVar7 * dVar5;
      }
      return dVar5;
    }
    cVar1 = pcVar2[t_str._M_len];
    dVar6 = dVar5;
    switch(cVar1) {
    case (chaiscript)0x2d:
      iVar3 = -1;
      break;
    case (chaiscript)0x2e:
      dVar4 = 10.0;
      break;
    case (chaiscript)0x2f:
    case (chaiscript)0x3a:
    case (chaiscript)0x3b:
    case (chaiscript)0x3c:
    case (chaiscript)0x3d:
    case (chaiscript)0x3e:
    case (chaiscript)0x3f:
    case (chaiscript)0x40:
    case (chaiscript)0x41:
    case (chaiscript)0x42:
    case (chaiscript)0x43:
    case (chaiscript)0x44:
      break;
    case (chaiscript)0x30:
    case (chaiscript)0x31:
    case (chaiscript)0x32:
    case (chaiscript)0x33:
    case (chaiscript)0x34:
    case (chaiscript)0x35:
    case (chaiscript)0x36:
    case (chaiscript)0x37:
    case (chaiscript)0x38:
    case (chaiscript)0x39:
      if (10.0 <= dVar4) {
        dVar6 = (double)((char)cVar1 + -0x30) / dVar4;
        dVar4 = dVar4 * 10.0;
        dVar6 = dVar5 + dVar6;
      }
      else {
        dVar6 = dVar5 * 10.0 + (double)((char)cVar1 + -0x30);
      }
      break;
    case (chaiscript)0x45:
switchD_0022b767_caseD_45:
      dVar4 = 0.0;
      iVar3 = 1;
      dVar6 = 0.0;
      dVar7 = dVar5;
      break;
    default:
      if (cVar1 == (chaiscript)0x65) goto switchD_0022b767_caseD_45;
    }
    pcVar2 = pcVar2 + 1;
    dVar5 = dVar6;
  } while( true );
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }